

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<160u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Ch CVar5;
  byte bVar6;
  bool bVar7;
  char *pcVar8;
  char cVar9;
  byte *pbVar10;
  undefined4 uVar11;
  int iVar12;
  uint i;
  ulong i_00;
  int iVar13;
  int iVar14;
  ulong uVar15;
  double d;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double local_68;
  
  pcVar8 = is->current_;
  pbVar10 = (byte *)(pcVar8 + (is->count_ - (long)is->buffer_));
  cVar1 = *pcVar8;
  cVar9 = cVar1;
  if (cVar1 == '-') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    pcVar8 = is->current_;
    cVar9 = *pcVar8;
  }
  if (cVar9 == '0') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    bVar6 = *is->current_;
    local_68 = 0.0;
    bVar7 = false;
    i_00 = 0;
    iVar14 = 0;
    bVar3 = false;
    bVar2 = false;
    i = 0;
  }
  else {
    if (8 < (byte)(cVar9 - 0x31U)) {
      pbVar10 = (byte *)(pcVar8 + (is->count_ - (long)is->buffer_));
      uVar11 = 3;
      goto LAB_0017e454;
    }
    CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    i = (int)CVar5 - 0x30;
    iVar14 = 0;
    if (cVar1 == '-') {
LAB_0017dfe4:
      bVar6 = *is->current_;
      if (9 < (byte)(bVar6 - 0x30)) goto LAB_0017e0ce;
      if (i < 0xccccccc) {
LAB_0017dffe:
        CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        i = (i * 10 + (int)CVar5) - 0x30;
        iVar14 = iVar14 + 1;
        goto LAB_0017dfe4;
      }
      if (i != 0xccccccc) goto LAB_0017e064;
      if (bVar6 < 0x39) goto LAB_0017dffe;
      i = 0xccccccc;
      bVar6 = 0x39;
LAB_0017e064:
      i_00 = (ulong)i;
      if (cVar1 == '-') {
        while ((byte)(bVar6 - 0x30) < 10) {
          if ((0xccccccccccccccb < i_00) && ((i_00 != 0xccccccccccccccc || (0x38 < bVar6))))
          goto LAB_0017e13e;
          CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
          i_00 = (ulong)((int)CVar5 - 0x30) + i_00 * 10;
          iVar14 = iVar14 + 1;
          bVar6 = *is->current_;
        }
      }
      else {
        while ((byte)(bVar6 - 0x30) < 10) {
          if ((0x1999999999999998 < i_00) && ((i_00 != 0x1999999999999999 || (0x35 < bVar6))))
          goto LAB_0017e13e;
          CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
          i_00 = (ulong)((int)CVar5 - 0x30) + i_00 * 10;
          iVar14 = iVar14 + 1;
          bVar6 = *is->current_;
        }
      }
      local_68 = 0.0;
      bVar2 = true;
      bVar7 = false;
      bVar3 = false;
    }
    else {
      while (bVar6 = *is->current_, (byte)(bVar6 - 0x30) < 10) {
        if (0x19999998 < i) {
          if (i != 0x19999999) goto LAB_0017e064;
          if (0x35 < bVar6) {
            i = 0x19999999;
            goto LAB_0017e064;
          }
        }
        CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        i = (i * 10 + (int)CVar5) - 0x30;
        iVar14 = iVar14 + 1;
      }
LAB_0017e0ce:
      local_68 = 0.0;
      bVar7 = false;
      i_00 = 0;
      bVar3 = false;
      bVar2 = false;
    }
  }
  goto LAB_0017e1c3;
LAB_0017e13e:
  auVar16._8_4_ = (int)(i_00 >> 0x20);
  auVar16._0_8_ = i_00;
  auVar16._12_4_ = 0x45300000;
  local_68 = (auVar16._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
  while ((byte)(bVar6 - 0x30) < 10) {
    CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    local_68 = local_68 * 10.0 + (double)(CVar5 + -0x30);
    bVar6 = *is->current_;
  }
  bVar7 = true;
  bVar3 = true;
  bVar2 = true;
LAB_0017e1c3:
  if (bVar6 == 0x2e) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    bVar6 = *is->current_;
    if ((byte)(bVar6 - 0x3a) < 0xf6) {
      pbVar10 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      uVar11 = 0xe;
      goto LAB_0017e454;
    }
    iVar12 = 0;
    if (!bVar7) {
      if (!bVar2) {
        i_00 = (ulong)i;
      }
      iVar12 = 0;
      while ((('/' < (char)bVar6 && (bVar6 < 0x3a)) && (i_00 >> 0x35 == 0))) {
        CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        iVar12 = iVar12 + -1;
        i_00 = (ulong)((int)CVar5 - 0x30) + i_00 * 10;
        iVar14 = iVar14 + (uint)(i_00 != 0);
        bVar6 = *is->current_;
      }
      auVar17._8_4_ = (int)(i_00 >> 0x20);
      auVar17._0_8_ = i_00;
      auVar17._12_4_ = 0x45300000;
      local_68 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)i_00) - 4503599627370496.0);
      bVar3 = true;
    }
    while ((byte)(bVar6 - 0x30) < 10) {
      if (iVar14 < 0x11) {
        CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        local_68 = (double)(CVar5 + -0x30) + local_68 * 10.0;
        iVar12 = iVar12 + -1;
        if (0.0 < local_68) {
          iVar14 = iVar14 + 1;
        }
      }
      else {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
      }
      bVar6 = *is->current_;
    }
  }
  else {
    iVar12 = 0;
  }
  if ((bVar6 | 0x20) == 0x65) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    uVar15 = (ulong)i;
    if (bVar2) {
      uVar15 = i_00;
    }
    if (!bVar3) {
      auVar18._8_4_ = (int)(uVar15 >> 0x20);
      auVar18._0_8_ = uVar15;
      auVar18._12_4_ = 0x45300000;
      local_68 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
      bVar3 = true;
    }
    bVar7 = false;
    bVar4 = false;
    if (*is->current_ == '+') {
LAB_0017e35d:
      bVar7 = bVar4;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    }
    else if (*is->current_ == '-') {
      bVar4 = true;
      goto LAB_0017e35d;
    }
    if (9 < (byte)(*is->current_ - 0x30U)) {
      pbVar10 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      uVar11 = 0xf;
      goto LAB_0017e454;
    }
    CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    iVar13 = CVar5 + -0x30;
    if (bVar7) {
      while ((byte)(*is->current_ - 0x30U) < 10) {
        CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        iVar13 = iVar13 * 10 + (int)CVar5 + -0x30;
        if ((iVar12 + 0x7ffffff7) / 10 < iVar13) {
          while ((byte)(*is->current_ - 0x30U) < 10) {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
          }
        }
      }
LAB_0017e411:
      iVar14 = -iVar13;
      if (!bVar7) {
        iVar14 = iVar13;
      }
      goto LAB_0017e424;
    }
    do {
      if (9 < (byte)(*is->current_ - 0x30U)) goto LAB_0017e411;
      CVar5 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
      iVar13 = iVar13 * 10 + (int)CVar5 + -0x30;
    } while (iVar13 <= 0x134 - iVar12);
LAB_0017e447:
    uVar11 = 0xd;
  }
  else {
    iVar14 = 0;
LAB_0017e424:
    if (bVar3) {
      d = internal::StrtodNormalPrecision(local_68,iVar14 + iVar12);
      if (1.79769313486232e+308 < d) goto LAB_0017e447;
      if (cVar1 == '-') {
        d = -d;
      }
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Double(handler,d);
    }
    else if (bVar2) {
      if (cVar1 == '-') {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-i_00);
      }
      else {
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint64(handler,i_00);
      }
    }
    else if (cVar1 == '-') {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int(handler,-i);
    }
    else {
      bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint(handler,i);
    }
    if (bVar7 != false) {
      return;
    }
    uVar11 = 0x10;
  }
LAB_0017e454:
  *(undefined4 *)(this + 0x30) = uVar11;
  *(byte **)(this + 0x38) = pbVar10;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }